

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ODDataBarReader.cpp
# Opt level: O2

int ZXing::OneD::ParseFinderPattern(PatternView *view,bool reversed)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  undefined7 in_register_00000031;
  array<ZXing::FixedPattern<5,_15,_false>,_10UL> *paVar6;
  array<ZXing::FixedPattern<5,_15,_false>,_10UL> *paVar7;
  array<ZXing::FixedPattern<5,_15,_false>,_10UL> aStack_d8;
  array<ZXing::FixedPattern<5,_15,_false>,_10UL> local_70;
  
  lVar4 = 100;
  paVar6 = &ParseFinderPattern::REVERSED_FINDER_PATTERNS;
  paVar7 = &local_70;
  for (lVar3 = lVar4; lVar3 != 0; lVar3 = lVar3 + -1) {
    *(char *)paVar7->_M_elems[0]._data = (char)paVar6->_M_elems[0]._data[0];
    paVar6 = (array<ZXing::FixedPattern<5,_15,_false>,_10UL> *)((long)paVar6->_M_elems[0]._data + 1)
    ;
    paVar7 = (array<ZXing::FixedPattern<5,_15,_false>,_10UL> *)((long)paVar7->_M_elems[0]._data + 1)
    ;
  }
  paVar6 = &ParseFinderPattern::FINDER_PATTERNS;
  paVar7 = &aStack_d8;
  for (; lVar4 != 0; lVar4 = lVar4 + -1) {
    *(char *)paVar7 = (char)paVar6->_M_elems[0]._data[0];
    paVar6 = (array<ZXing::FixedPattern<5,_15,_false>,_10UL> *)((long)paVar6->_M_elems[0]._data + 1)
    ;
    paVar7 = (array<ZXing::FixedPattern<5,_15,_false>,_10UL> *)((long)paVar7 + 1);
  }
  iVar5 = (int)CONCAT71(in_register_00000031,reversed);
  paVar6 = &aStack_d8;
  if (iVar5 != 0) {
    paVar6 = &local_70;
  }
  uVar1 = RowReader::
          DecodeDigit<ZXing::PatternView,std::array<ZXing::FixedPattern<5,15,false>,10ul>>
                    (view,paVar6,0.2,0.45,true);
  uVar2 = ~uVar1;
  if (iVar5 == 0) {
    uVar2 = uVar1 + 1;
  }
  return uVar2;
}

Assistant:

int ParseFinderPattern(const PatternView& view, bool reversed)
{
	static constexpr std::array<FixedPattern<5, 15>, 10> FINDER_PATTERNS = {{
		{3, 8, 2, 1, 1},
		{3, 5, 5, 1, 1},
		{3, 3, 7, 1, 1},
		{3, 1, 9, 1, 1},
		{2, 7, 4, 1, 1},
		{2, 5, 6, 1, 1},
		{2, 3, 8, 1, 1},
		{1, 5, 7, 1, 1},
		{1, 3, 9, 1, 1},
	}};

	// TODO: c++20 constexpr inversion from FIND_PATTERN?
	static constexpr std::array<FixedPattern<5, 15>, 10> REVERSED_FINDER_PATTERNS = {{
		{1, 1, 2, 8, 3}, {1, 1, 5, 5, 3}, {1, 1, 7, 3, 3}, {1, 1, 9, 1, 3}, {1, 1, 4, 7, 2},
		{1, 1, 6, 5, 2}, {1, 1, 8, 3, 2}, {1, 1, 7, 5, 1}, {1, 1, 9, 3, 1},
	}};

	return ParseFinderPattern(view, reversed, FINDER_PATTERNS, REVERSED_FINDER_PATTERNS);
}